

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLoc.cpp
# Opt level: O1

void __thiscall
llvm::DWARFDebugLoc::dump
          (DWARFDebugLoc *this,raw_ostream *OS,MCRegisterInfo *MRI,DIDumpOptions DumpOpts,
          Optional<unsigned_long> Offset)

{
  void *__n;
  char *pcVar1;
  LocationList *pLVar2;
  ulong uVar3;
  size_t sVar4;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  long lVar5;
  format_object_base local_50;
  uint64_t local_40;
  MCRegisterInfo *local_38;
  
  local_38 = MRI;
  if (((undefined1  [16])Offset.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    uVar3 = (ulong)(this->Locations).super_SmallVectorImpl<llvm::DWARFDebugLoc::LocationList>.
                   super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::LocationList,_false>.
                   super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>.
                   super_SmallVectorBase.Size;
    if (uVar3 != 0) {
      pLVar2 = (LocationList *)
               (this->Locations).super_SmallVectorImpl<llvm::DWARFDebugLoc::LocationList>.
               super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::LocationList,_false>.
               super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>.
               super_SmallVectorBase.BeginX;
      lVar5 = uVar3 * 0x68;
      do {
        local_50.Fmt = "0x%8.8lx: ";
        local_50._vptr_format_object_base = (_func_int **)&PTR_home_01097f70;
        local_40 = pLVar2->Offset;
        raw_ostream::operator<<(OS,&local_50);
        sVar4 = (size_t)this->IsLittleEndian;
        LocationList::dump(pLVar2,OS,0,this->IsLittleEndian,this->AddressSize,local_38,
                           (DWARFUnit *)0x0,DumpOpts,0xc);
        if (OS->OutBufEnd == OS->OutBufCur) {
          raw_ostream::write(OS,0xe5017f,(void *)0x1,sVar4);
          __buf = extraout_RDX_00;
        }
        else {
          *OS->OutBufCur = '\n';
          OS->OutBufCur = OS->OutBufCur + 1;
          __buf = extraout_RDX;
        }
        uVar3 = (ulong)(this->Locations).super_SmallVectorImpl<llvm::DWARFDebugLoc::LocationList>.
                       super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::LocationList,_false>.
                       super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>.
                       super_SmallVectorBase.Size;
        if (uVar3 == 0) {
          __assert_fail("!empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                        ,0xab,
                        "const_reference llvm::SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList>::back() const [T = llvm::DWARFDebugLoc::LocationList]"
                       );
        }
        __n = (this->Locations).super_SmallVectorImpl<llvm::DWARFDebugLoc::LocationList>.
              super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::LocationList,_false>.
              super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>.
              super_SmallVectorBase.BeginX;
        if (pLVar2 != (LocationList *)((long)__n + uVar3 * 0x68 + -0x68)) {
          pcVar1 = OS->OutBufCur;
          if (pcVar1 < OS->OutBufEnd) {
            OS->OutBufCur = pcVar1 + 1;
            *pcVar1 = '\n';
          }
          else {
            raw_ostream::write(OS,10,__buf,(size_t)__n);
          }
        }
        pLVar2 = pLVar2 + 1;
        lVar5 = lVar5 + -0x68;
      } while (lVar5 != 0);
    }
  }
  else {
    pLVar2 = getLocationListAtOffset(this,Offset.Storage.field_0.value);
    if (pLVar2 != (LocationList *)0x0) {
      local_50.Fmt = "0x%8.8lx: ";
      local_50._vptr_format_object_base = (_func_int **)&PTR_home_01097f70;
      local_40 = pLVar2->Offset;
      raw_ostream::operator<<(OS,&local_50);
      sVar4 = (size_t)this->IsLittleEndian;
      LocationList::dump(pLVar2,OS,0,this->IsLittleEndian,this->AddressSize,local_38,
                         (DWARFUnit *)0x0,DumpOpts,0xc);
      if (OS->OutBufEnd == OS->OutBufCur) {
        raw_ostream::write(OS,0xe5017f,(void *)0x1,sVar4);
      }
      else {
        *OS->OutBufCur = '\n';
        OS->OutBufCur = OS->OutBufCur + 1;
      }
    }
  }
  return;
}

Assistant:

void DWARFDebugLoc::dump(raw_ostream &OS, const MCRegisterInfo *MRI, DIDumpOptions DumpOpts,
                         Optional<uint64_t> Offset) const {
  auto DumpLocationList = [&](const LocationList &L) {
    OS << format("0x%8.8" PRIx64 ": ", L.Offset);
    L.dump(OS, 0, IsLittleEndian, AddressSize, MRI, nullptr, DumpOpts, 12);
    OS << "\n";
  };

  if (Offset) {
    if (auto *L = getLocationListAtOffset(*Offset))
      DumpLocationList(*L);
    return;
  }

  for (const LocationList &L : Locations) {
    DumpLocationList(L);
    if (&L != &Locations.back())
      OS << '\n';
  }
}